

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O1

void __thiscall scriptnum_tests::creation::test_method(creation *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      RunCreate(&values + lVar3);
      lVar1 = (&values)[lVar3];
      lVar2 = *(long *)((long)&offsets + lVar4);
      local_40 = lVar2 + lVar1;
      RunCreate(&local_40);
      local_40 = lVar1 - lVar2;
      RunCreate(&local_40);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x48);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xd);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(creation)
{
    for(size_t i = 0; i < std::size(values); ++i)
    {
        for(size_t j = 0; j < std::size(offsets); ++j)
        {
            RunCreate(values[i]);
            RunCreate(values[i] + offsets[j]);
            RunCreate(values[i] - offsets[j]);
        }
    }
}